

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_parser.c
# Opt level: O3

uint8_t * apx_signatureParser_parse_data_element
                    (apx_signatureParser_t *self,uint8_t *begin,uint8_t *end)

{
  byte bVar1;
  apx_signatureParserState_t *paVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  apx_typeCode_t type_code;
  uint8_t uVar7;
  apx_error_t aVar8;
  uint8_t *puVar9;
  apx_dataElement_t *paVar10;
  byte *pbVar11;
  apx_signatureParserState_t *paVar12;
  uint8_t *puVar13;
  byte *pbVar14;
  byte *pbVar15;
  bool bVar16;
  uint32_t local_34;
  
  if (self->state == (apx_signatureParserState_t *)0x0) {
    __assert_fail("(self != NULL) && (self->state != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                  ,0xc5,
                  "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                 );
  }
  if (self->state->is_record == true) {
    puVar9 = bstr_match_pair(begin,end,'\"','\"','\\');
    if (puVar9 <= begin) {
      self->error_code = 3;
      self->error_pos = begin;
      return (uint8_t *)0x0;
    }
    puVar13 = begin + 1;
    pbVar15 = puVar9 + 1;
  }
  else {
    puVar9 = (uint8_t *)0x0;
    puVar13 = (uint8_t *)0x0;
    pbVar15 = begin;
  }
  if (end <= pbVar15) {
    return begin;
  }
  bVar1 = *pbVar15;
  if (bVar1 < 0x51) {
    if (0x41 < bVar1) {
      if (bVar1 == 0x42) {
        type_code = '\x0e';
      }
      else {
        if (bVar1 == 0x43) {
          bVar4 = true;
          bVar6 = false;
          bVar5 = false;
          bVar16 = false;
          bVar3 = false;
          type_code = '\x01';
          goto LAB_00137603;
        }
        if (bVar1 != 0x4c) goto switchD_001374d6_caseD_52;
        type_code = '\x03';
      }
      goto LAB_001374fb;
    }
    if (bVar1 == 0x28) goto switchD_001374d6_caseD_5b;
    if (bVar1 == 0x41) {
      type_code = '\n';
      goto LAB_001374ab;
    }
    goto switchD_001374d6_caseD_52;
  }
  switch(bVar1) {
  case 0x51:
    type_code = '\x04';
    bVar5 = true;
    bVar6 = false;
    goto LAB_001375f3;
  case 0x52:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    goto switchD_001374d6_caseD_52;
  case 0x53:
    type_code = '\x02';
LAB_001374fb:
    bVar4 = true;
    bVar6 = false;
    bVar5 = false;
    goto LAB_001375f9;
  case 0x54:
    type_code = '\x10';
    bVar6 = true;
    bVar5 = false;
    bVar4 = false;
    bVar16 = true;
    goto LAB_001375fb;
  case 0x55:
    type_code = '\f';
    break;
  case 0x5b:
switchD_001374d6_caseD_5b:
    self->error_code = 0xb;
    goto LAB_00137677;
  case 0x61:
    type_code = '\t';
    break;
  case 0x62:
    type_code = '\r';
    break;
  case 99:
    type_code = '\x05';
    goto LAB_001375e5;
  default:
    switch(bVar1) {
    case 0x6c:
      type_code = '\a';
      break;
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x74:
      goto switchD_001374d6_caseD_52;
    case 0x71:
      type_code = '\b';
      bVar6 = true;
      bVar16 = false;
      bVar5 = true;
      bVar4 = true;
      goto LAB_001375fb;
    case 0x73:
      type_code = '\x06';
      break;
    case 0x75:
      type_code = '\v';
      goto LAB_001374ab;
    default:
      if (bVar1 != 0x7b) goto switchD_001374d6_caseD_52;
      bVar6 = true;
      type_code = '\x0f';
      bVar5 = false;
      bVar4 = false;
      bVar16 = false;
      bVar3 = true;
      goto LAB_00137603;
    }
LAB_001375e5:
    bVar6 = true;
    bVar5 = false;
LAB_001375f3:
    bVar4 = true;
    goto LAB_001375f9;
  }
LAB_001374ab:
  bVar6 = true;
  bVar5 = false;
  bVar4 = false;
LAB_001375f9:
  bVar16 = false;
LAB_001375fb:
  bVar3 = false;
LAB_00137603:
  paVar10 = apx_dataElement_new(type_code);
  self->state->data_element = paVar10;
  if (paVar10 == (apx_dataElement_t *)0x0) {
    self->error_code = 2;
LAB_00137677:
    self->error_pos = pbVar15;
    return (uint8_t *)0x0;
  }
  pbVar15 = pbVar15 + 1;
  if (puVar13 != (uint8_t *)0x0) {
    if ((puVar9 == (uint8_t *)0x0) || (puVar9 < puVar13)) {
      __assert_fail("(name_end != NULL) && (name_begin <= name_end)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                    ,0x13b,
                    "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                   );
    }
    aVar8 = apx_dataElement_set_name_bstr(paVar10,puVar13,puVar9);
    if (aVar8 != 0) {
      self->error_code = aVar8;
      goto LAB_00137677;
    }
  }
  if (bVar16) {
    pbVar11 = apx_signatureParser_parse_type_reference(self,pbVar15,end);
    if (pbVar11 <= pbVar15) {
switchD_001374d6_caseD_52:
      self->error_code = 3;
      goto LAB_00137677;
    }
  }
  else {
    pbVar11 = pbVar15;
    if (bVar3) {
      paVar2 = self->state;
      paVar12 = (apx_signatureParserState_t *)malloc(0x10);
      if (paVar12 != (apx_signatureParserState_t *)0x0) {
        paVar12->is_record = true;
        paVar12->data_element = (apx_dataElement_t *)0x0;
      }
      self->state = paVar12;
      do {
        if (end <= pbVar11) goto LAB_00137729;
        pbVar15 = apx_signatureParser_parse_data_element(self,pbVar11,end);
        if (pbVar15 <= pbVar11) {
          self->error_code = 3;
          self->error_pos = pbVar11;
          paVar12 = self->state;
LAB_0013787e:
          apx_signatureParserState_delete(paVar12);
          self->state = paVar2;
          return (uint8_t *)0x0;
        }
        if (paVar2->data_element == (apx_dataElement_t *)0x0) {
          __assert_fail("parent->data_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                        ,0x15b,
                        "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        paVar10 = self->state->data_element;
        if (paVar10 == (apx_dataElement_t *)0x0) {
          __assert_fail("self->state->data_element != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/signature_parser.c"
                        ,0x15c,
                        "const uint8_t *apx_signatureParser_parse_data_element(apx_signatureParser_t *, const uint8_t *, const uint8_t *)"
                       );
        }
        apx_dataElement_append_child(paVar2->data_element,paVar10);
        paVar12 = self->state;
        paVar12->data_element = (apx_dataElement_t *)0x0;
        if (end <= pbVar15) {
          self->error_code = 3;
          self->error_pos = pbVar15;
          goto LAB_0013787e;
        }
        pbVar11 = pbVar15;
      } while (*pbVar15 != 0x7d);
      apx_signatureParserState_delete(paVar12);
      self->state = paVar2;
      pbVar11 = pbVar15 + 1;
    }
  }
LAB_00137729:
  pbVar15 = pbVar11;
  if (bVar4) {
    if (bVar5) {
      if (bVar6) {
        pbVar15 = apx_signatureParser_parse_limits_i64(self,pbVar11,end);
      }
      else {
        pbVar15 = apx_signatureParser_parse_limits_u64(self,pbVar11,end);
      }
    }
    else if (bVar6) {
      pbVar15 = apx_signatureParser_parse_limits_i32(self,pbVar11,end);
    }
    else {
      pbVar15 = apx_signatureParser_parse_limits_u32(self,pbVar11,end);
    }
    if ((pbVar15 <= pbVar11) && (bVar16 = pbVar15 == (byte *)0x0, pbVar15 = pbVar11, bVar16))
    goto LAB_00137838;
  }
  pbVar14 = pbVar15;
  pbVar11 = pbVar15;
  if (pbVar15 < end) {
    if (*pbVar15 != 0x5b) {
      return pbVar15;
    }
    puVar9 = bstr_lstrip(pbVar15 + 1,end);
    if ((end <= puVar9) ||
       (puVar13 = apx_parserBase_parse_u32(puVar9,end,&local_34), puVar13 <= puVar9))
    goto LAB_00137838;
    apx_dataElement_set_array_length(self->state->data_element,local_34);
    puVar9 = bstr_lstrip(puVar13,end);
    if (end <= puVar9) goto LAB_00137838;
    uVar7 = *puVar9;
    if (uVar7 == '*') {
      apx_dataElement_set_dynamic_array(self->state->data_element);
      puVar9 = bstr_lstrip(puVar9 + 1,end);
      if (end <= puVar9) goto LAB_00137838;
      uVar7 = *puVar9;
    }
    pbVar14 = (byte *)0x0;
    if (uVar7 == ']') {
      pbVar14 = puVar9 + 1;
    }
    if (pbVar15 < pbVar14) {
      return pbVar14;
    }
  }
  if (pbVar14 != (byte *)0x0) {
    return pbVar15;
  }
LAB_00137838:
  self->error_code = 3;
  self->error_pos = pbVar11;
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t const* apx_signatureParser_parse_data_element(apx_signatureParser_t* self, uint8_t const* begin, uint8_t const* end)
{
   uint8_t const* next = begin;
   uint8_t const* name_begin = NULL;
   uint8_t const* name_end = NULL;
   uint8_t const* result = NULL;
   assert( (self != NULL) && (self->state != NULL) );

   if (self->state->is_record)
   {
      result = bstr_match_pair(next, end, '"', '"', '\\');
      if (result > next)
      {
         name_begin = next + 1; //Don't include first '"' character
         name_end = result;
         next = result + 1; //Move past second '"' character
      }
      else
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   if (next >= end)
   {
      return begin;
   }
   const char c = *next;
   bool is_signed_type = true;
   bool is_64_bit_type = false;
   bool check_limits = true;
   apx_typeCode_t type_code = APX_TYPE_CODE_NONE;
   apx_tokenClass_t token_class = APX_TOKEN_CLASS_DATA_ELEMENT;
   switch (c)
   {
   case '{':
      type_code = APX_TYPE_CODE_RECORD;
      check_limits = false;
      break;
   case '[':
      token_class = APX_TOKEN_GROUP_DECLARATION;
      check_limits = false;
      break;
   case '(':
      token_class = APX_TOKEN_FUNCTION_DECLARATION;
      check_limits = false;
      break;
   case 'a':
      type_code = APX_TYPE_CODE_CHAR;
      check_limits = false;
      break;
   case 'A':
      type_code = APX_TYPE_CODE_CHAR8;
      check_limits = false;
      break;
   case 'b':
      type_code = APX_TYPE_CODE_BOOL;
      check_limits = false;
      break;
   case 'B':
      type_code = APX_TYPE_CODE_BYTE;
      is_signed_type = false;
      break;
   case 'c':
      type_code = APX_TYPE_CODE_INT8;
      break;
   case 'C':
      type_code = APX_TYPE_CODE_UINT8;
      is_signed_type = false;
      break;
   case 'l':
      type_code = APX_TYPE_CODE_INT32;
      break;
   case 'L':
      type_code = APX_TYPE_CODE_UINT32;
      is_signed_type = false;
      break;
   case 'q':
      type_code = APX_TYPE_CODE_INT64;
      is_64_bit_type = true;
      break;
   case 'Q':
      type_code = APX_TYPE_CODE_UINT64;
      is_signed_type = false;
      is_64_bit_type = true;
      break;
   case 's':
      type_code = APX_TYPE_CODE_INT16;
      break;
   case 'S':
      type_code = APX_TYPE_CODE_UINT16;
      is_signed_type = false;
      break;
   case 'T':
      type_code = APX_TYPE_CODE_REF_ID; //Initial guess, might change while parsing continues
      check_limits = false;
      break;
   case 'u':
      type_code = APX_TYPE_CODE_CHAR16;
      check_limits = false;
      break;
   case 'U':
      type_code = APX_TYPE_CODE_CHAR32;
      check_limits = false;
      break;
   }
   if (token_class == APX_TOKEN_CLASS_DATA_ELEMENT)
   {
      if (type_code == APX_TYPE_CODE_NONE)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
      else
      {
         self->state->data_element = apx_dataElement_new(type_code);
         if (self->state->data_element == NULL)
         {
            apx_signatureParser_set_error(self, APX_MEM_ERROR, next);
            return NULL;
         }
         next++;
         if (name_begin != NULL)
         {
            assert((name_end != NULL) && (name_begin <= name_end));
            apx_error_t rc = apx_dataElement_set_name_bstr(self->state->data_element, name_begin, name_end);
            if (rc != APX_NO_ERROR)
            {
               apx_signatureParser_set_error(self, rc, next);
               return NULL;
            }
         }
      }
      if (type_code == APX_TYPE_CODE_REF_ID)
      {
         result = apx_signatureParser_parse_type_reference(self, next, end);
         if (result > next)
         {
            next = result;
         }
         else
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      else if (type_code == APX_TYPE_CODE_RECORD)
      {
         apx_signatureParserState_t* parent = self->state;
         self->state = apx_signatureParserState_new(true);
         while (next < end)
         {
            result = apx_signatureParser_parse_data_element(self, next, end);
            if (result > next)
            {
               next = result;
               assert(parent->data_element != NULL);
               assert(self->state->data_element != NULL);
               apx_dataElement_append_child(parent->data_element, self->state->data_element);
               self->state->data_element = NULL; //Move ownership to parent
            }
            else
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (next >= end)
            {
               apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               return NULL;
            }
            if (*next == '}')
            {
               next++;
               apx_signatureParserState_delete(self->state);
               self->state = parent;
               break;
            }
         }
      }
      if (check_limits)
      {
         if (is_64_bit_type)
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i64(self, next, end) : apx_signatureParser_parse_limits_u64(self, next, end);
         }
         else
         {
            result = is_signed_type ? apx_signatureParser_parse_limits_i32(self, next, end) : apx_signatureParser_parse_limits_u32(self, next, end);
         }
         if (result > next)
         {
            next = result;
         }
         else if (result == NULL)
         {
            apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
            return NULL;
         }
      }
      result = apx_signatureParser_parse_array(self, next, end);
      if (result > next)
      {
         next = result;
      }
      else if (result == NULL)
      {
         apx_signatureParser_set_error(self, APX_PARSE_ERROR, next);
         return NULL;
      }
   }
   else
   {
      apx_signatureParser_set_error(self, APX_NOT_IMPLEMENTED_ERROR, next);
      return NULL;
   }
   return next;
}